

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *field)

{
  ModuleField *pMVar1;
  pointer __p;
  _Head_base<0UL,_wabt::ModuleField_*,_false> _Var2;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_68;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_60;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_58;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_50;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_48;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_40;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_38;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_30;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_28;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_20;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_18;
  
  pMVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>._M_t.
           super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
           super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl;
  switch(pMVar1->type_) {
  case Func:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_68._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                      *)&local_68);
    _Var2._M_head_impl = local_68._M_head_impl;
    break;
  case Global:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_60._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                      *)&local_60);
    _Var2._M_head_impl = local_60._M_head_impl;
    break;
  case Import:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_58._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                      *)&local_58);
    _Var2._M_head_impl = local_58._M_head_impl;
    break;
  case Export:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_50._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                      *)&local_50);
    _Var2._M_head_impl = local_50._M_head_impl;
    break;
  case FuncType:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_48._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                      *)&local_48);
    _Var2._M_head_impl = local_48._M_head_impl;
    break;
  case Table:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_40._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                      *)&local_40);
    _Var2._M_head_impl = local_40._M_head_impl;
    break;
  case ElemSegment:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_38._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)&local_38);
    _Var2._M_head_impl = local_38._M_head_impl;
    break;
  case Memory:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_30._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                      *)&local_30);
    _Var2._M_head_impl = local_30._M_head_impl;
    break;
  case DataSegment:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_28._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                      *)&local_28);
    _Var2._M_head_impl = local_28._M_head_impl;
    break;
  case Start:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_20._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                      *)&local_20);
    _Var2._M_head_impl = local_20._M_head_impl;
    break;
  case Except:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_18._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
                      *)&local_18);
    _Var2._M_head_impl = local_18._M_head_impl;
    break;
  default:
    goto switchD_00f4806d_default;
  }
  if (_Var2._M_head_impl != (ModuleField *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_ModuleField[1])();
    return;
  }
switchD_00f4806d_default:
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<ModuleField> field) {
  switch (field->type()) {
    case ModuleFieldType::Func:
      AppendField(cast<FuncModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Global:
      AppendField(cast<GlobalModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Import:
      AppendField(cast<ImportModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Export:
      AppendField(cast<ExportModuleField>(std::move(field)));
      break;

    case ModuleFieldType::FuncType:
      AppendField(cast<FuncTypeModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Table:
      AppendField(cast<TableModuleField>(std::move(field)));
      break;

    case ModuleFieldType::ElemSegment:
      AppendField(cast<ElemSegmentModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Memory:
      AppendField(cast<MemoryModuleField>(std::move(field)));
      break;

    case ModuleFieldType::DataSegment:
      AppendField(cast<DataSegmentModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Start:
      AppendField(cast<StartModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Except:
      AppendField(cast<ExceptionModuleField>(std::move(field)));
      break;
  }
}